

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_set_error.c
# Opt level: O0

void test_archive_set_error(void)

{
  archive *a;
  char *in_stack_00000010;
  int in_stack_0000001c;
  archive *in_stack_00000020;
  
  archive_read_new();
  test(in_stack_00000020,in_stack_0000001c,in_stack_00000010);
  test(in_stack_00000020,in_stack_0000001c,in_stack_00000010);
  test(in_stack_00000020,in_stack_0000001c,in_stack_00000010);
  test(in_stack_00000020,in_stack_0000001c,in_stack_00000010);
  archive_read_free((archive *)0x136724);
  return;
}

Assistant:

DEFINE_TEST(test_archive_set_error)
{
	struct archive* a = archive_read_new();

	/* unlike printf("%s", NULL),
	 * archive_set_error(a, code, "%s", NULL)
	 * segfaults, so it's not tested here */
	test(a, 12, "abcdefgh");
	test(a, 0, "123456");
	test(a, -1, "tuvw");
	test(a, 34, "XYZ");

	archive_read_free(a);
}